

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O0

bool __thiscall wirehair::Codec::AllocateWorkspace(Codec *this)

{
  uint8_t *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  Codec *in_RDI;
  uint ii;
  uint64_t sizeBytes;
  uint32_t column_count;
  uint32_t row_count;
  uint64_t recoverySizeBytes;
  uint recovery_rows;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  uVar2 = (uint)in_RDI->_block_count + (uint)in_RDI->_mix_count + 1;
  lVar5 = (ulong)uVar2 * (ulong)in_RDI->_block_bytes;
  uVar3 = (uint)in_RDI->_block_count + (uint)in_RDI->_extra_count;
  uVar4 = (uint)in_RDI->_block_count;
  uVar6 = lVar5 + (ulong)uVar3 * 0x18 + (ulong)uVar4 * 6 + (ulong)uVar4 * 0x42 + (ulong)uVar3;
  if (in_RDI->_workspace_allocated < uVar6) {
    FreeWorkspace(in_RDI);
    puVar1 = SIMDSafeAllocate(CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    in_RDI->_recovery_blocks = puVar1;
    if (in_RDI->_recovery_blocks == (uint8_t *)0x0) {
      return false;
    }
    in_RDI->_workspace_allocated = uVar6;
  }
  in_RDI->_peel_rows = (PeelRow *)(in_RDI->_recovery_blocks + lVar5);
  in_RDI->_peel_cols = (PeelColumn *)(in_RDI->_peel_rows + uVar3);
  in_RDI->_peel_col_refs = (PeelRefs *)(in_RDI->_peel_cols + uVar4);
  in_RDI->_copied_original = (uint8_t *)(in_RDI->_peel_col_refs + uVar4);
  in_RDI->_recovery_rows = uVar2;
  for (uVar2 = 0; uVar2 < in_RDI->_block_count; uVar2 = uVar2 + 1) {
    in_RDI->_peel_col_refs[uVar2].RowCount = 0;
    in_RDI->_peel_cols[uVar2].field_1.Weight2Refs = 0;
    in_RDI->_peel_cols[uVar2].Mark = '\0';
  }
  return true;
}

Assistant:

bool Codec::AllocateWorkspace()
{
    CAT_IF_DUMP(cout << endl << "---- AllocateWorkspace ----" << endl << endl;)

    // +1 for temporary space for MultiplyDenseValues()
    const unsigned recovery_rows = _block_count + _mix_count + 1;
    const uint64_t recoverySizeBytes = static_cast<uint64_t>(recovery_rows) * _block_bytes;

    // Count needed rows and columns
    const uint32_t row_count = _block_count + _extra_count;
    const uint32_t column_count = _block_count;

    // Calculate size
    const uint64_t sizeBytes = recoverySizeBytes
        + sizeof(PeelRow) * row_count
        + sizeof(PeelColumn) * column_count
        + sizeof(PeelRefs) * column_count
        + row_count;

    if (_workspace_allocated < sizeBytes)
    {
        FreeWorkspace();

        // Allocate workspace
        _recovery_blocks = SIMDSafeAllocate((size_t)sizeBytes);
        if (!_recovery_blocks) {
            return false;
        }
        _workspace_allocated = sizeBytes;
    }

    // Set pointers
    _peel_rows = reinterpret_cast<PeelRow *>( _recovery_blocks + recoverySizeBytes );
    _peel_cols = reinterpret_cast<PeelColumn *>( _peel_rows + row_count );
    _peel_col_refs = reinterpret_cast<PeelRefs *>( _peel_cols + column_count );
    _copied_original = reinterpret_cast<uint8_t *>( _peel_col_refs + column_count );

    _recovery_rows = recovery_rows;

    CAT_IF_DUMP(cout << "Memory overhead for workspace = " << sizeBytes << " bytes" << endl;)

    // Initialize columns
    for (unsigned ii = 0; ii < _block_count; ++ii)
    {
        _peel_col_refs[ii].RowCount = 0;
        _peel_cols[ii].Weight2Refs = 0;
        _peel_cols[ii].Mark = MARK_TODO;
    }

    return true;
}